

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_bind_double(sqlite3_stmt *pStmt,int i,double rValue)

{
  int iVar1;
  
  iVar1 = vdbeUnbind((Vdbe *)pStmt,i);
  if (iVar1 == 0) {
    sqlite3VdbeMemSetDouble((Mem *)(*(long *)(pStmt + 0xa0) + (long)i * 0x38 + -0x38),rValue);
    if (*(sqlite3_mutex **)(*(long *)pStmt + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
    }
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_bind_double(sqlite3_stmt *pStmt, int i, double rValue){
  int rc;
  Vdbe *p = (Vdbe *)pStmt;
  rc = vdbeUnbind(p, i);
  if( rc==SQLITE_OK ){
    sqlite3VdbeMemSetDouble(&p->aVar[i-1], rValue);
    sqlite3_mutex_leave(p->db->mutex);
  }
  return rc;
}